

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::Malloc::~Malloc(Malloc *this)

{
  ~Malloc((Malloc *)&this[-1].size);
  return;
}

Assistant:

Malloc(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> size)
      : IRInst(InstType::Malloc), Definition(std::move(dest)),
        size(std::move(size)) {}